

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool parse_cpu_mask(string *mask,bool (*boolmask) [512])

{
  char cVar1;
  pointer pcVar2;
  char cVar3;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined8 uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 uVar13;
  int iVar14;
  ulong uVar15;
  common_log *pcVar16;
  ulong uVar17;
  ulong uVar18;
  bool *pbVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  short sVar25;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  long *local_40 [2];
  long local_30 [2];
  char cVar4;
  char cVar5;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined2 uVar24;
  undefined4 uVar26;
  undefined6 uVar27;
  
  uVar17 = mask->_M_string_length;
  if (uVar17 < 2) {
    uVar18 = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)mask);
    iVar14 = std::__cxx11::string::compare((char *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    uVar18 = (ulong)((uint)(iVar14 == 0) * 2);
    uVar17 = mask->_M_string_length;
  }
  auVar12 = _DAT_002220a0;
  auVar11 = _DAT_00222090;
  uVar15 = uVar17 - uVar18;
  if (0x7f < uVar15) {
    uVar15 = 0x80;
  }
  if (uVar17 != uVar18) {
    pcVar2 = (mask->_M_dataplus)._M_p;
    pbVar19 = *boolmask + uVar15 * 4;
    uVar15 = uVar15 + uVar18;
    do {
      pbVar19 = pbVar19 + -4;
      if (uVar17 <= uVar18) {
        uVar13 = std::__throw_out_of_range_fmt
                           ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                            uVar18);
        llama_log_set(common_init::anon_class_1_0_00000001::__invoke,0);
        if (-1 < common_log_verbosity_thold) {
          pcVar16 = common_log_main();
          common_log_add(pcVar16,GGML_LOG_LEVEL_INFO,"build: %d (%s) with %s for %s%s\n",
                         (ulong)(uint)LLAMA_BUILD_NUMBER,LLAMA_COMMIT,LLAMA_COMPILER,
                         LLAMA_BUILD_TARGET,"");
        }
        return (bool)uVar13;
      }
      cVar1 = pcVar2[uVar18];
      bVar20 = cVar1 - 0x30;
      if (9 < bVar20) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar20 = cVar1 + 0xa9;
        }
        else {
          if (5 < (byte)(cVar1 + 0xbfU)) {
            if (-1 < common_log_verbosity_thold) {
              pcVar16 = common_log_main();
              common_log_add(pcVar16,GGML_LOG_LEVEL_ERROR,
                             "Invalid hex character \'%c\' at position %d\n",(ulong)(uint)(int)cVar1
                             ,uVar18 & 0xffffffff);
              return false;
            }
            return false;
          }
          bVar20 = cVar1 - 0x37;
        }
      }
      uVar26 = *(undefined4 *)pbVar19;
      uVar13 = (undefined1)((uint)uVar26 >> 0x18);
      uVar24 = CONCAT11(uVar13,uVar13);
      uVar13 = (undefined1)((uint)uVar26 >> 0x10);
      uVar9 = CONCAT35(CONCAT21(uVar24,uVar13),CONCAT14(uVar13,uVar26));
      uVar13 = (undefined1)((uint)uVar26 >> 8);
      uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar13),uVar13);
      auVar30._0_2_ = CONCAT11((char)uVar26,(char)uVar26);
      uVar10 = CONCAT62(uVar27,auVar30._0_2_);
      auVar23._8_4_ = 0;
      auVar23._0_8_ = uVar10;
      auVar23._12_2_ = uVar24;
      auVar23._14_2_ = uVar24;
      uVar24 = (undefined2)((ulong)uVar9 >> 0x20);
      auVar22._12_4_ = auVar23._12_4_;
      auVar22._8_2_ = 0;
      auVar22._0_8_ = uVar10;
      auVar22._10_2_ = uVar24;
      auVar21._10_6_ = auVar22._10_6_;
      auVar21._8_2_ = uVar24;
      auVar21._0_8_ = uVar10;
      uVar24 = (undefined2)uVar27;
      auVar30._8_8_ = auVar21._8_8_;
      auVar30._6_2_ = uVar24;
      auVar30._4_2_ = uVar24;
      auVar30._2_2_ = auVar30._0_2_;
      auVar28._1_3_ = 0;
      auVar28[0] = bVar20;
      auVar28[4] = bVar20;
      auVar28._5_3_ = 0;
      auVar28[8] = bVar20;
      auVar28._9_3_ = 0;
      auVar28[0xc] = bVar20;
      auVar28._13_3_ = 0;
      auVar28 = auVar28 & auVar11;
      auVar29._0_4_ = -(uint)(auVar28._0_4_ == auVar11._0_4_);
      auVar29._4_4_ = -(uint)(auVar28._4_4_ == auVar11._4_4_);
      auVar29._8_4_ = -(uint)(auVar28._8_4_ == auVar11._8_4_);
      auVar29._12_4_ = -(uint)(auVar28._12_4_ == auVar11._12_4_);
      auVar30 = (auVar29 | auVar30) & auVar12;
      sVar6 = auVar30._0_2_;
      cVar1 = (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6);
      sVar6 = auVar30._2_2_;
      sVar25 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar30[2] - (0xff < sVar6),cVar1);
      sVar6 = auVar30._4_2_;
      cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar30[4] - (0xff < sVar6);
      sVar6 = auVar30._6_2_;
      uVar26 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar30[6] - (0xff < sVar6),
                        CONCAT12(cVar3,sVar25));
      sVar6 = auVar30._8_2_;
      cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar30[8] - (0xff < sVar6);
      sVar6 = auVar30._10_2_;
      uVar27 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar30[10] - (0xff < sVar6),
                        CONCAT14(cVar4,uVar26));
      sVar6 = auVar30._12_2_;
      cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar30[0xc] - (0xff < sVar6);
      sVar8 = auVar30._14_2_;
      sVar6 = (short)((uint)uVar26 >> 0x10);
      sVar7 = (short)((uint6)uVar27 >> 0x20);
      sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar30[0xe] - (0xff < sVar8),
                               CONCAT16(cVar5,uVar27)) >> 0x30);
      *(uint *)pbVar19 =
           CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                    CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                             CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                      (0 < sVar25) * (sVar25 < 0x100) * cVar1 - (0xff < sVar25))));
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar15);
  }
  return true;
}

Assistant:

bool parse_cpu_mask(const std::string & mask, bool (&boolmask)[GGML_MAX_N_THREADS]) {
    // Discard potential 0x prefix
    size_t start_i = 0;
    if (mask.length() >= 2 && mask.substr(0, 2) == "0x") {
        start_i = 2;
    }

    size_t num_digits = mask.length() - start_i;
    if (num_digits > 128) num_digits = 128;

    size_t end_i = num_digits + start_i;

    for (size_t i = start_i, n = (num_digits*4 - 1); i < end_i; i++, n-=4) {
        char c = mask.at(i);
        int8_t id = c;

        if ((c >= '0' && c <= '9')) {
            id -= '0';
        } else if (c >= 'a' && c <= 'f') {
            id -= 'a' - 10;
        } else if (c >= 'A' && c <= 'F') {
            id -= 'A' - 10;
        } else {
            LOG_ERR("Invalid hex character '%c' at position %d\n", c, int32_t(i));
            return false;
        }

        boolmask[  n  ] = boolmask[  n  ] || ((id & 8) != 0);
        boolmask[n - 1] = boolmask[n - 1] || ((id & 4) != 0);
        boolmask[n - 2] = boolmask[n - 2] || ((id & 2) != 0);
        boolmask[n - 3] = boolmask[n - 3] || ((id & 1) != 0);
    }

    return true;
}